

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsStatus calculateColDualsQuad(HighsLp *lp,HighsSolution *solution)

{
  size_type sVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  bool bVar10;
  HighsStatus HVar11;
  size_type __new_size;
  size_type sVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> col_dual_quad;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_58;
  value_type local_38;
  
  pdVar5 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar6 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = lp->num_row_;
  bVar10 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  HVar11 = kError;
  if ((bVar10) && (iVar3 == (int)((ulong)((long)pdVar5 - (long)pdVar6) >> 3))) {
    local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.hi = 0.0;
    local_38.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&local_58,(long)lp->num_col_,&local_38);
    __new_size = (size_type)lp->num_col_;
    if (0 < (long)__new_size) {
      pdVar5 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = 0;
      do {
        iVar3 = piVar7[sVar12];
        lVar13 = (long)iVar3;
        iVar4 = piVar7[sVar12 + 1];
        if (iVar3 < iVar4) {
          dVar14 = local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar12].lo;
          dVar15 = local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar12].hi;
          do {
            dVar16 = pdVar6[piVar8[lVar13]] * pdVar9[lVar13];
            dVar17 = dVar16 + dVar15;
            local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[sVar12].hi = dVar17;
            dVar14 = dVar14 + (dVar15 - (dVar17 - dVar16)) + (dVar16 - (dVar17 - (dVar17 - dVar16)))
            ;
            local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[sVar12].lo = dVar14;
            lVar13 = lVar13 + 1;
            dVar15 = dVar17;
          } while (iVar4 != lVar13);
        }
        sVar1 = sVar12 + 1;
        dVar14 = pdVar5[sVar12];
        dVar15 = local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar12].hi;
        dVar16 = dVar14 + dVar15;
        local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[sVar12].hi = dVar16;
        local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[sVar12].lo =
             (dVar15 - (dVar16 - dVar14)) + (dVar14 - (dVar16 - (dVar16 - dVar14))) +
             local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start[sVar12].lo;
        sVar12 = sVar1;
      } while (sVar1 != __new_size);
    }
    std::vector<double,_std::allocator<double>_>::resize(&solution->col_dual,__new_size);
    if (local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar5 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        pdVar2 = (double *)
                 ((long)&(local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                          _M_impl.super__Vector_impl_data._M_start)->hi + lVar13 * 2);
        *(double *)((long)pdVar5 + lVar13) = *pdVar2 + pdVar2[1];
        lVar13 = lVar13 + 8;
      } while ((pointer)(pdVar2 + 2) !=
               local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    HVar11 = kOk;
  }
  return HVar11;
}

Assistant:

HighsStatus calculateColDualsQuad(const HighsLp& lp, HighsSolution& solution) {
  const bool correct_size = int(solution.row_dual.size()) == lp.num_row_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> col_dual_quad;
  col_dual_quad.assign(lp.num_col_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      col_dual_quad[col] += solution.row_dual[row] * lp.a_matrix_.value_[i];
    }
    col_dual_quad[col] += lp.col_cost_[col];
  }

  // assign quad values to double vector
  solution.col_dual.resize(lp.num_col_);
  std::transform(col_dual_quad.begin(), col_dual_quad.end(),
                 solution.col_dual.begin(),
                 [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}